

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall
iu_Matcher_x_iutest_x_ContainerEq_Test::Body(iu_Matcher_x_iutest_x_ContainerEq_Test *this)

{
  bool bVar1;
  detail *pdVar2;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *v;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *v_00;
  AssertionResult *in_R8;
  string local_960;
  string local_940;
  AssertionHelper local_920;
  Fixed local_8f0;
  ContainerEqMatcher<int[10]> local_768;
  undefined1 local_738 [8];
  AssertionResult iutest_ar_3;
  string local_6f0;
  AssertionHelper local_6d0;
  Fixed local_6a0;
  ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_> local_518;
  undefined1 local_4e8 [8];
  AssertionResult iutest_ar_2;
  string local_4a0;
  AssertionHelper local_480;
  Fixed local_450;
  ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_> local_2c8;
  undefined1 local_298 [8];
  AssertionResult iutest_ar_1;
  string local_250;
  AssertionHelper local_230;
  Fixed local_200;
  ContainerEqMatcher<int[10]> local_68;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_ContainerEq_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::matchers::ContainerEq<int[10]>(&local_68,(int (*) [10])(anonymous_namespace)::ga);
  iutest::detail::ContainerEqMatcher<int[10]>::operator()
            ((AssertionResult *)local_38,&local_68,(int (*) [10])(anonymous_namespace)::ga);
  iutest::detail::ContainerEqMatcher<int[10]>::~ContainerEqMatcher(&local_68);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_200,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_200);
    iutest::PrintToString<int[10]>
              ((string *)&iutest_ar_1.m_result,(int (*) [10])(anonymous_namespace)::ga);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_250,pdVar2,"ContainerEq(ga)",local_38,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,299,&local_250,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_230,&local_200);
    iutest::AssertionHelper::~AssertionHelper(&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_200);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  iutest::matchers::ContainerEq<std::vector<int,std::allocator<int>>>
            (&local_2c8,(matchers *)(anonymous_namespace)::va,expected);
  iutest::detail::ContainerEqMatcher<std::vector<int,std::allocator<int>>>::operator()
            ((AssertionResult *)local_298,
             (ContainerEqMatcher<std::vector<int,std::allocator<int>>> *)&local_2c8,
             (vector<int,_std::allocator<int>_> *)(anonymous_namespace)::va);
  iutest::detail::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>::~ContainerEqMatcher
            (&local_2c8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    memset(&local_450,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_450);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              ((string *)&iutest_ar_2.m_result,(iutest *)(anonymous_namespace)::va,v);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_4a0,pdVar2,"ContainerEq(va)",local_298,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,300,&local_4a0,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_480,&local_450);
    iutest::AssertionHelper::~AssertionHelper(&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_450);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  iutest::detail::AlwaysZero();
  iutest::matchers::ContainerEq<std::vector<int,std::allocator<int>>>
            (&local_518,(matchers *)(anonymous_namespace)::va,expected_00);
  iutest::detail::ContainerEqMatcher<std::vector<int,std::allocator<int>>>::operator()
            ((AssertionResult *)local_4e8,
             (ContainerEqMatcher<std::vector<int,std::allocator<int>>> *)&local_518,
             (int (*) [10])(anonymous_namespace)::ga);
  iutest::detail::ContainerEqMatcher<std::vector<int,_std::allocator<int>_>_>::~ContainerEqMatcher
            (&local_518);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    memset(&local_6a0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_6a0);
    iutest::PrintToString<int[10]>
              ((string *)&iutest_ar_3.m_result,(int (*) [10])(anonymous_namespace)::ga);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_6f0,pdVar2,"ContainerEq(va)",local_4e8,in_R8);
    in_R8 = (AssertionResult *)0x1;
    iutest::AssertionHelper::AssertionHelper
              (&local_6d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x12e,&local_6f0,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_6d0,&local_6a0);
    iutest::AssertionHelper::~AssertionHelper(&local_6d0);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_6a0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  iutest::detail::AlwaysZero();
  iutest::matchers::ContainerEq<int[10]>(&local_768,(int (*) [10])(anonymous_namespace)::ga);
  iutest::detail::ContainerEqMatcher<int[10]>::operator()
            ((AssertionResult *)local_738,&local_768,
             (vector<int,_std::allocator<int>_> *)(anonymous_namespace)::va);
  iutest::detail::ContainerEqMatcher<int[10]>::~ContainerEqMatcher(&local_768);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    memset(&local_8f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_8f0);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              (&local_960,(iutest *)(anonymous_namespace)::va,v_00);
    pdVar2 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_940,pdVar2,"ContainerEq(ga)",local_738,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_920,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x12f,&local_940,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_920,&local_8f0);
    iutest::AssertionHelper::~AssertionHelper(&local_920);
    std::__cxx11::string::~string((string *)&local_940);
    std::__cxx11::string::~string((string *)&local_960);
    iutest::AssertionHelper::Fixed::~Fixed(&local_8f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  return;
}

Assistant:

IUTEST(Matcher, ContainerEq)
{
    IUTEST_EXPECT_THAT(ga, ContainerEq(ga));
    IUTEST_EXPECT_THAT(va, ContainerEq(va));
#if !defined(IUTEST_USE_GTEST)
    IUTEST_EXPECT_THAT(ga, ContainerEq(va));
    IUTEST_EXPECT_THAT(va, ContainerEq(ga));
#endif
}